

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O2

sc_actions sc_core::sc_report_handler::execute(sc_msg_def *md,sc_severity severity_)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  long lVar7;
  uint *puVar8;
  uint uVar9;
  
  uVar2 = (ulong)severity_;
  uVar3 = md->sev_actions[uVar2];
  if ((uVar3 == 0) && (uVar3 = md->actions, uVar3 == 0)) {
    uVar3 = (&sev_actions)[uVar2];
  }
  uVar3 = ~suppress_mask & uVar3 | force_mask;
  if (md->sev_call_count[uVar2] != 0xffffffff) {
    md->sev_call_count[uVar2] = md->sev_call_count[uVar2] + 1;
  }
  if (md->call_count != 0xffffffff) {
    md->call_count = md->call_count + 1;
  }
  if (*(int *)(sev_call_count + uVar2 * 4) != -1) {
    *(int *)(sev_call_count + uVar2 * 4) = *(int *)(sev_call_count + uVar2 * 4) + 1;
  }
  uVar4 = severity_ + SC_WARNING;
  uVar1 = md->limit_mask;
  lVar7 = (long)(int)severity_;
  puVar6 = (uint *)0x0;
  if ((uVar1 & 1) != 0) {
    puVar6 = &md->limit;
  }
  puVar8 = md->sev_limit + lVar7;
  if ((uVar1 >> (uVar4 & 0x1f) & 1) == 0) {
    puVar8 = puVar6;
  }
  uVar9 = 1 << (uVar4 & 0x1f) | 1;
  puVar6 = (uint *)(sev_limit + lVar7 * 4);
  if ((uVar1 & uVar9) != 0) {
    puVar6 = puVar8;
  }
  if (1 < *puVar6 + 1) {
    puVar8 = &md->call_count;
    if ((uVar1 & 1) == 0) {
      puVar8 = (uint *)0x0;
    }
    puVar5 = md->sev_call_count + lVar7;
    if ((uVar1 & 1 << ((byte)uVar4 & 0x1f)) == 0) {
      puVar5 = puVar8;
    }
    if ((uVar1 & uVar9) == 0) {
      puVar5 = (uint *)(sev_call_count + lVar7 * 4);
    }
    if (*puVar6 <= *puVar5) {
      uVar3 = uVar3 | 0x40;
    }
  }
  return uVar3;
}

Assistant:

sc_actions sc_report_handler::execute(sc_msg_def* md, sc_severity severity_)
{
    sc_actions actions = md->sev_actions[severity_]; // high prio

    if ( SC_UNSPECIFIED == actions ) // middle prio
	actions = md->actions;

    if ( SC_UNSPECIFIED == actions ) // the lowest prio
	actions = sev_actions[severity_];

    actions &= ~suppress_mask; // higher than the high prio
    actions |= force_mask; // higher than above, and the limit is the highest

    unsigned * limit = 0;
    unsigned * call_count = 0;

    // just increment counters and check for overflow
    if ( md->sev_call_count[severity_] < UINT_MAX )
	md->sev_call_count[severity_]++;
    if ( md->call_count < UINT_MAX )
	md->call_count++;
    if ( sev_call_count[severity_] < UINT_MAX )
	sev_call_count[severity_]++;

    if ( md->limit_mask & (1 << (severity_ + 1)) )
    {
	limit = md->sev_limit + severity_;
	call_count = md->sev_call_count + severity_;
    }
    if ( !limit && (md->limit_mask & 1) )
    {
	limit = &md->limit;
	call_count = &md->call_count;
    }
    if ( !limit )
    {
	limit = sev_limit + severity_;
	call_count = sev_call_count + severity_;
    }
    if ( *limit == 0 )
    {
	// stop limit disabled
    }
    else if ( *limit != UINT_MAX )
    {
	if ( *call_count >= *limit )
	    actions |= SC_STOP; // force sc_stop()
    }
    return actions;
}